

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::detail::parseFlag(int argc,char **argv,char *pattern)

{
  bool bVar1;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  bVar1 = parseFlagImpl(argc,argv,pattern);
  if (bVar1) {
    argv_local._7_1_ = true;
  }
  else {
    argv_local._7_1_ = parseFlagImpl(argc,argv,pattern + 3);
  }
  return argv_local._7_1_;
}

Assistant:

bool parseFlag(int argc, const char* const* argv, const char* pattern) {
#ifndef DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        if(!parseFlagImpl(argc, argv, pattern))
            return parseFlagImpl(argc, argv, pattern + 3); // 3 for "dt-"
        return true;
#else  // DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        return parseFlagImpl(argc, argv, pattern);
#endif // DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
    }